

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNSnameConstraintsTest38<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section13InvalidDNSnameConstraintsTest38<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.13.38";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a8bc0,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005a8be0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNSnameConstraintsTest38) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDNS1CACert",
                               "InvalidDNSnameConstraintsTest38EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDNS1CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.38";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}